

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clunk.cpp
# Opt level: O0

int __thiscall clunk::Node::QSearch<true>(Node *this,int alpha,int beta,int depth)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  HashEntry *this_00;
  uint64_t uVar4;
  Move *this_01;
  Move *move;
  HashEntry *entry;
  int score;
  int local_24;
  int best;
  int depth_local;
  int beta_local;
  int alpha_local;
  Node *this_local;
  
  local_24 = depth;
  best = beta;
  depth_local = alpha;
  _beta_local = this;
  if (beta <= alpha) {
    __assert_fail("alpha < beta",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xeff,"int clunk::Node::QSearch(int, int, const int) [color = true]");
  }
  iVar2 = alpha;
  if (alpha < 1) {
    iVar2 = -alpha;
  }
  if (32000 < iVar2) {
    __assert_fail("abs(alpha) <= Infinity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf00,"int clunk::Node::QSearch(int, int, const int) [color = true]");
  }
  iVar2 = beta;
  if (beta < 1) {
    iVar2 = -beta;
  }
  if (32000 < iVar2) {
    __assert_fail("abs(beta) <= Infinity",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf01,"int clunk::Node::QSearch(int, int, const int) [color = true]");
  }
  if (0 < depth) {
    __assert_fail("depth <= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf02,"int clunk::Node::QSearch(int, int, const int) [color = true]");
  }
  DAT_001aab68 = DAT_001aab68 + 1;
  if (_seldepth < this->ply) {
    _seldepth = this->ply;
  }
  this->pvCount = 0;
  this->depthChange = 0;
  bVar1 = IsDraw(this);
  iVar2 = DAT_001a9af4;
  if (bVar1) {
    this->standPat = DAT_001a9af4;
    return iVar2;
  }
  score = this->ply + -32000;
  piVar3 = std::max<int>(&score,&depth_local);
  depth_local = *piVar3;
  entry._4_4_ = 0x7d01 - this->ply;
  piVar3 = std::min<int>((int *)((long)&entry + 4),&best);
  best = *piVar3;
  if (best <= depth_local || this->child == (Node *)0x0) {
    return depth_local;
  }
  this_00 = TranspositionTable<clunk::HashEntry>::Get
                      ((TranspositionTable<clunk::HashEntry> *)_tt,this->positionKey);
  uVar4 = HashEntry::Key(this_00);
  if (uVar4 != this->positionKey) goto LAB_001512dc;
  TranspositionTable<clunk::HashEntry>::IncHits((TranspositionTable<clunk::HashEntry> *)_tt);
  iVar2 = HashEntry::GetPrimaryFlag(this_00);
  this_local._4_4_ = DAT_001a9af4;
  switch(iVar2) {
  case 1:
    this_local._4_4_ = this->ply + -32000;
    break;
  case 2:
    this->standPat = DAT_001a9af4;
    break;
  case 3:
    entry._0_4_ = HashEntry::Score(this_00,this->ply);
    if ((int)entry <= depth_local) {
      return (int)entry;
    }
    goto LAB_001512dc;
  case 4:
    this_local._4_4_ = HashEntry::Score(this_00,this->ply);
    break;
  case 5:
    entry._0_4_ = HashEntry::Score(this_00,this->ply);
    if (best <= (int)entry) {
      return (int)entry;
    }
LAB_001512dc:
    if (depth_local < score) {
      __assert_fail("best <= alpha",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xf31,"int clunk::Node::QSearch(int, int, const int) [color = true]");
    }
    if (best <= depth_local) {
      __assert_fail("alpha < beta",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xf32,"int clunk::Node::QSearch(int, int, const int) [color = true]");
    }
    if (this->pvCount != 0) {
      __assert_fail("!pvCount",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                    ,0xf33,"int clunk::Node::QSearch(int, int, const int) [color = true]");
    }
    if (this->checks == 0) {
      Evaluate(this);
      if (best <= this->standPat) {
        return this->standPat;
      }
      piVar3 = std::max<int>(&depth_local,&this->standPat);
      depth_local = *piVar3;
      score = this->standPat;
      if (depth_local < score) {
        __assert_fail("best <= alpha",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xf3d,"int clunk::Node::QSearch(int, int, const int) [color = true]");
      }
      if (best <= depth_local) {
        __assert_fail("alpha < beta",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xf3e,"int clunk::Node::QSearch(int, int, const int) [color = true]");
      }
    }
    GenerateMoves<true,true>(this,local_24);
    if (this->moveCount < 1) {
      if (this->checks == 0) {
        this_local._4_4_ = this->standPat;
      }
      else {
        HashEntry::SetCheckmate(this_00,this->positionKey);
        TranspositionTable<clunk::HashEntry>::IncCheckmates
                  ((TranspositionTable<clunk::HashEntry> *)_tt);
        this_local._4_4_ = this->ply + -32000;
      }
    }
    else {
      while (this_01 = GetNextMove(this), this_01 != (Move *)0x0) {
        bVar1 = Move::IsValid(this_01);
        if (!bVar1) {
          __assert_fail("move->IsValid()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0xf50,"int clunk::Node::QSearch(int, int, const int) [color = true]");
        }
        if (depth_local < score) {
          __assert_fail("best <= alpha",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0xf51,"int clunk::Node::QSearch(int, int, const int) [color = true]");
        }
        if (best <= depth_local) {
          __assert_fail("alpha < beta",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0xf52,"int clunk::Node::QSearch(int, int, const int) [color = true]");
        }
        DAT_001aab90 = DAT_001aab90 + 1;
        Exec<true>(this,this_01,this->child);
        iVar2 = QSearch<false>(this->child,-best,-depth_local,local_24 + -1);
        entry._0_4_ = -iVar2;
        Undo<true>(this,this_01);
        if (_stop != 0) {
          return best;
        }
        if (score < (int)entry) {
          UpdatePV(this,this_01);
          if (best <= (int)entry) {
            return (int)entry;
          }
          piVar3 = std::max<int>(&depth_local,(int *)&entry);
          depth_local = *piVar3;
          score = (int)entry;
        }
        if (best <= depth_local) {
          __assert_fail("alpha < beta",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                        ,0xf62,"int clunk::Node::QSearch(int, int, const int) [color = true]");
        }
      }
      if (depth_local < score) {
        __assert_fail("best <= alpha",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xf65,"int clunk::Node::QSearch(int, int, const int) [color = true]");
      }
      if (best <= depth_local) {
        __assert_fail("alpha < beta",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                      ,0xf66,"int clunk::Node::QSearch(int, int, const int) [color = true]");
      }
      this_local._4_4_ = score;
    }
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zd3nik[P]Clunk/src/Clunk.cpp"
                  ,0xf2d,"int clunk::Node::QSearch(int, int, const int) [color = true]");
  }
  return this_local._4_4_;
}

Assistant:

int QSearch(int alpha, int beta, const int depth) {
    assert(alpha < beta);
    assert(abs(alpha) <= Infinity);
    assert(abs(beta) <= Infinity);
    assert(depth <= 0);

    _stats.qnodes++;
    if (ply > _seldepth) {
      _seldepth = ply;
    }

    pvCount = 0;
    depthChange = 0;

    if (IsDraw()) {
      return (standPat = _drawScore[color]);
    }

    // mate distance pruning
    int best = (ply - Infinity);
    alpha = std::max<int>(best, alpha);
    beta = std::min<int>((Infinity - ply + 1), beta);
    if ((alpha >= beta) | !child) {
      return alpha;
    }

    // transposition table lookup
    int score;
    HashEntry* entry = _tt.Get(positionKey);
    if (entry->Key() == positionKey) {
      _tt.IncHits();
      switch (entry->GetPrimaryFlag()) {
      case HashEntry::Checkmate: return (ply - Infinity);
      case HashEntry::Stalemate: return (standPat = _drawScore[color]);
      case HashEntry::UpperBound:
        if ((score = entry->Score(ply)) <= alpha) {
          return score;
        }
        break;
      case HashEntry::ExactScore:
        return entry->Score(ply);
      case HashEntry::LowerBound:
        if ((score = entry->Score(ply)) >= beta) {
          return score;
        }
        break;
      default:
        assert(false);
      }
    }

    assert(best <= alpha);
    assert(alpha < beta);
    assert(!pvCount);

    // if not in check allow standPat
    if (!checks) {
      Evaluate();
      if (standPat >= beta) {
        return standPat;
      }
      alpha = std::max<int>(alpha, standPat);
      best = standPat;
      assert(best <= alpha);
      assert(alpha < beta);
    }

    // generate moves
    GenerateMoves<color, true>(depth);
    if (moveCount <= 0) {
      if (checks) {
        entry->SetCheckmate(positionKey);
        _tt.IncCheckmates();
        return (ply - Infinity);
      }
      // don't call _tt.StoreStalemate()!!!
      return standPat;
    }

    // search 'em
    Move* move;
    while ((move = GetNextMove())) {
      assert(move->IsValid());
      assert(best <= alpha);
      assert(alpha < beta);
      _stats.qexecs++;
      Exec<color>(*move, *child);
      score = -child->QSearch<!color>(-beta, -alpha, (depth - 1));
      Undo<color>(*move);
      if (_stop) {
        return beta;
      }
      if (score > best) {
        UpdatePV(*move);
        if (score >= beta) {
          return score;
        }
        alpha = std::max<int>(alpha, score);
        best = score;
      }
      assert(alpha < beta);
    }

    assert(best <= alpha);
    assert(alpha < beta);
    return best;
  }